

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::removeSegment(anon_unknown_0 *this,Module *wasm,Name segment)

{
  Name name;
  Name segment_00;
  DataSegment *pDVar1;
  SegmentRemover local_250;
  undefined1 local_110 [8];
  PassRunner runner;
  Module *wasm_local;
  Name segment_local;
  
  runner._232_8_ = this;
  PassRunner::PassRunner((PassRunner *)local_110,(Module *)this);
  segment_00.super_IString.str._M_str = segment.super_IString.str._M_len;
  segment_00.super_IString.str._M_len = (size_t)wasm;
  SegmentRemover::SegmentRemover(&local_250,segment_00);
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>_>
  ::run(&local_250.
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::SegmentRemover,_wasm::Visitor<wasm::(anonymous_namespace)::SegmentRemover,_void>_>_>
        ,(PassRunner *)local_110,(Module *)runner._232_8_);
  SegmentRemover::~SegmentRemover(&local_250);
  name.super_IString.str._M_str = segment.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)wasm;
  pDVar1 = Module::getDataSegment((Module *)runner._232_8_,name);
  std::vector<char,_std::allocator<char>_>::resize(&pDVar1->data,0);
  PassRunner::~PassRunner((PassRunner *)local_110);
  return;
}

Assistant:

static void removeSegment(Module& wasm, Name segment) {
  PassRunner runner(&wasm);
  SegmentRemover(segment).run(&runner, &wasm);
  // Resize the segment to zero. TODO: Remove it entirely instead.
  wasm.getDataSegment(segment)->data.resize(0);
}